

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlBufferPtr xmlBufferCreateSize(size_t size)

{
  uint uVar1;
  xmlBufferPtr pxVar2;
  xmlChar *pxVar3;
  uint uVar4;
  
  if ((size < 0x7fffffff) &&
     (pxVar2 = (xmlBufferPtr)(*xmlMalloc)(0x20), pxVar2 != (xmlBufferPtr)0x0)) {
    pxVar2->use = 0;
    pxVar2->alloc = XML_BUFFER_ALLOC_IO;
    uVar4 = (int)size + 1;
    uVar1 = 0;
    if (size != 0) {
      uVar1 = uVar4;
    }
    pxVar2->size = uVar1;
    if (size == 0) {
      pxVar2->contentIO = (xmlChar *)0x0;
      pxVar2->content = (xmlChar *)0x0;
      return pxVar2;
    }
    pxVar3 = (xmlChar *)(*xmlMalloc)((size_t)uVar4);
    pxVar2->contentIO = pxVar3;
    if (pxVar3 != (xmlChar *)0x0) {
      pxVar2->content = pxVar3;
      *pxVar3 = '\0';
      return pxVar2;
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlBufferPtr)0x0;
}

Assistant:

xmlBufferPtr
xmlBufferCreateSize(size_t size) {
    xmlBufferPtr ret;

    if (size >= INT_MAX)
        return(NULL);

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    ret->use = 0;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */

    if (ret->size) {
        ret->contentIO = xmlMalloc(ret->size);
        if (ret->contentIO == NULL) {
            xmlFree(ret);
            return(NULL);
        }
        ret->content = ret->contentIO;
        ret->content[0] = 0;
    } else {
        ret->contentIO = NULL;
	ret->content = NULL;
    }

    return(ret);
}